

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.h
# Opt level: O1

vector<unsigned_char,_std::allocator<unsigned_char>_> *
ToByteVector<CPubKey>
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,CPubKey *in
          )

{
  byte bVar1;
  long lVar2;
  long in_FS_OFFSET;
  allocator_type local_11;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = 0x21;
  if ((in->vch[0] & 0xfe) != 2) {
    bVar1 = in->vch[0] - 4;
    if (bVar1 < 4) {
      lVar2 = (&DAT_0081cf98)[bVar1];
    }
    else {
      lVar2 = 0;
    }
  }
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,in->vch,
             in->vch + lVar2,&local_11);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<unsigned char> ToByteVector(const T& in)
{
    return std::vector<unsigned char>(in.begin(), in.end());
}